

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O2

void __thiscall deqp::egl::MakeCurrentPerfCase::createContexts(MakeCurrentPerfCase *this)

{
  deUint32 dVar1;
  int iVar2;
  Library *pLVar3;
  undefined4 extraout_var;
  int contextNdx;
  int iVar4;
  EGLContext context;
  EGLint attribList [3];
  value_type local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  pLVar3 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  for (iVar4 = 0; iVar4 < (this->m_spec).contextCount; iVar4 = iVar4 + 1) {
    local_40 = 0x200003098;
    local_38 = 0x3038;
    (**pLVar3->_vptr_Library)(pLVar3,0x30a0);
    dVar1 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
    eglu::checkError(dVar1,"bindAPI(EGL_OPENGL_ES_API)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                     ,0x17e);
    iVar2 = (*pLVar3->_vptr_Library[6])(pLVar3,this->m_display,this->m_config,0,&local_40);
    local_48 = (value_type)CONCAT44(extraout_var,iVar2);
    dVar1 = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
    eglu::checkError(dVar1,"eglCreateContext()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                     ,0x180);
    std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_contexts,&local_48);
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::createContexts (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	for (int contextNdx = 0; contextNdx < m_spec.contextCount; contextNdx++)
	{
		const EGLint attribList[] = {
			EGL_CONTEXT_CLIENT_VERSION, 2,
			EGL_NONE
		};

		EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));
		EGLContext context = egl.createContext(m_display, m_config, EGL_NO_CONTEXT, attribList);
		EGLU_CHECK_MSG(egl, "eglCreateContext()");

		m_contexts.push_back(context);
	}
}